

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O1

int init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  Am_Object *pAVar1;
  Am_Wrapper *pAVar2;
  Am_Constraint *pAVar3;
  Am_Object *pAVar4;
  Am_Object_Advanced obj_adv;
  Am_Object h_scroll;
  Am_Object v_scroll;
  Am_Formula local_a0;
  Am_Object local_90;
  Am_Formula local_88;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Formula local_50;
  Am_Formula local_40;
  Am_Formula local_30;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Object_Advanced::Am_Object_Advanced((Am_Object_Advanced *)&local_90);
  local_68.data = (Am_Object_Data *)0x0;
  local_70.data = (Am_Object_Data *)0x0;
  Am_Object::Create(&local_78,(char *)&Am_Widget_Group);
  pAVar1 = Am_Object::Add(&local_78,0x11d,0,0);
  pAVar1 = Am_Object::Add(pAVar1,0x11e,0,0);
  pAVar1 = Am_Object::Set(pAVar1,0x66,0x96,0);
  pAVar1 = Am_Object::Set(pAVar1,0x67,0x96,0);
  pAVar1 = Am_Object::Add(pAVar1,0xcc,true,0);
  pAVar1 = Am_Object::Add(pAVar1,0x17d,true,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar1 = Am_Object::Add(pAVar1,0x6a,pAVar2,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar1 = Am_Object::Add(pAVar1,0x6b,pAVar2,0);
  pAVar1 = Am_Object::Add(pAVar1,400,0,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18a,true,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18b,true,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18c,false,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18d,false,0);
  pAVar1 = Am_Object::Add(pAVar1,0x1bb,10,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_jump_page);
  pAVar1 = Am_Object::Add(pAVar1,0x1bc,pAVar3,0);
  pAVar1 = Am_Object::Add(pAVar1,0x1bd,10,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_jump_page);
  pAVar1 = Am_Object::Add(pAVar1,0x1be,pAVar3,0);
  pAVar1 = Am_Object::Set(pAVar1,2000,scrolling_group_draw.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x7d7,scrolling_group_invalid.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x7dc,scroll_group_translate_coordinates.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x7da,scroll_group_point_in_part.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x7db,scroll_group_point_in_leaf.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x7d9,scroll_group_point_in_obj.from_wrapper,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18e,400,0);
  pAVar1 = Am_Object::Add(pAVar1,399,400,0);
  pAVar1 = Am_Object::Add(pAVar1,0xc5,-1,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Set_Old_Owner_To_Me);
  pAVar1 = Am_Object::Add(pAVar1,0x12d,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_left);
  pAVar1 = Am_Object::Add(pAVar1,0x1bf,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_top);
  pAVar1 = Am_Object::Add(pAVar1,0x1c0,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_width);
  pAVar1 = Am_Object::Add(pAVar1,0x1c1,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_height);
  pAVar1 = Am_Object::Add(pAVar1,0x1c2,pAVar3,0);
  Am_Object::Create(&local_20,(char *)&Am_Vertical_Scroll_Bar);
  pAVar4 = Am_Object::Set(&local_20,0x169,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&set_v_scroller_value_from_y_offset);
  pAVar4 = Am_Object::Add(pAVar4,0x8c,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_left);
  pAVar4 = Am_Object::Set(pAVar4,100,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_top);
  pAVar4 = Am_Object::Set(pAVar4,0x65,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_height);
  pAVar4 = Am_Object::Set(pAVar4,0x67,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_visible);
  pAVar4 = Am_Object::Set(pAVar4,0x69,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_active);
  pAVar4 = Am_Object::Set(pAVar4,0xcc,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_a0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_a0);
  pAVar4 = Am_Object::Set(pAVar4,0x17d,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_88);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_88);
  pAVar4 = Am_Object::Set(pAVar4,0x17f,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_30);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_30);
  pAVar4 = Am_Object::Set(pAVar4,0x6a,pAVar3,0);
  pAVar4 = Am_Object::Set(pAVar4,0x181,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_value_2);
  pAVar4 = Am_Object::Set(pAVar4,0x182,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_40);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_40);
  pAVar4 = Am_Object::Set(pAVar4,0x183,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_50);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_50);
  pAVar4 = Am_Object::Set(pAVar4,0x184,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_percent_visible);
  pAVar4 = Am_Object::Set(pAVar4,0x185,pAVar3,0);
  pAVar4 = Am_Object::operator=(&local_68,pAVar4);
  Am_Object::Am_Object(&local_18,pAVar4);
  pAVar1 = Am_Object::Add_Part(pAVar1,0x1c4,&local_18,0);
  Am_Object::operator=(&Am_Scrolling_Group,pAVar1);
  Am_Object::~Am_Object(&local_18);
  Am_Formula::~Am_Formula(&local_50);
  Am_Formula::~Am_Formula(&local_40);
  Am_Formula::~Am_Formula(&local_30);
  Am_Formula::~Am_Formula(&local_88);
  Am_Formula::~Am_Formula(&local_a0);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_78);
  Am_Object::Create(&local_78,(char *)&Am_Horizontal_Scroll_Bar);
  pAVar1 = Am_Object::Set(&local_78,0x169,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&set_h_scroller_value_from_x_offset);
  pAVar1 = Am_Object::Add(pAVar1,0x8b,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_left);
  pAVar1 = Am_Object::Set(pAVar1,100,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_top);
  pAVar1 = Am_Object::Set(pAVar1,0x65,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_width);
  pAVar1 = Am_Object::Set(pAVar1,0x66,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_visible);
  pAVar1 = Am_Object::Set(pAVar1,0x69,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_active);
  pAVar1 = Am_Object::Set(pAVar1,0xcc,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_a0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_a0);
  pAVar1 = Am_Object::Set(pAVar1,0x17d,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_88);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_88);
  pAVar1 = Am_Object::Set(pAVar1,0x17f,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_30);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_30);
  pAVar1 = Am_Object::Set(pAVar1,0x6a,pAVar3,0);
  pAVar1 = Am_Object::Set(pAVar1,0x181,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_value_2);
  pAVar1 = Am_Object::Set(pAVar1,0x182,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_40);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_40);
  pAVar1 = Am_Object::Set(pAVar1,0x183,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_50);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_50);
  pAVar1 = Am_Object::Set(pAVar1,0x184,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_percent_visible);
  pAVar1 = Am_Object::Set(pAVar1,0x185,pAVar3,0);
  pAVar1 = Am_Object::operator=(&local_70,pAVar1);
  Am_Object::Am_Object(&local_58,pAVar1);
  Am_Object::Add_Part(&Am_Scrolling_Group,0x1c3,&local_58,0);
  Am_Object::~Am_Object(&local_58);
  Am_Formula::~Am_Formula(&local_50);
  Am_Formula::~Am_Formula(&local_40);
  Am_Formula::~Am_Formula(&local_30);
  Am_Formula::~Am_Formula(&local_88);
  Am_Formula::~Am_Formula(&local_a0);
  Am_Object::~Am_Object(&local_78);
  Am_Object::operator=(&local_90,&Am_Scrolling_Group);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x6b);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x11d);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x11e);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x18a);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x18b);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x18c);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x18d);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,400);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  Am_Object::Am_Object(&local_60,&Am_Scrolling_Group);
  remove_scrollers(&local_60);
  Am_Object::~Am_Object(&local_60);
  Am_Object::Get_Object((Am_Object *)&local_a0,(Am_Slot_Key)&local_68,0xc5);
  pAVar1 = Am_Object::Set((Am_Object *)&local_a0,0x150,"Scroll Vertical",0);
  pAVar1 = Am_Object::Set(pAVar1,0xca,scroll_group_v_do.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x146,scroll_group_v_undo.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x147,scroll_group_v_undo.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x148,scroll_group_v_selective_undo.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x149,scroll_group_v_selective_repeat.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x14a,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&get_impl_parent_from_group);
  pAVar1 = Am_Object::Set(pAVar1,0x154,pAVar3,0);
  Am_Object::Set(pAVar1,0x167,-2,0);
  Am_Object::~Am_Object((Am_Object *)&local_a0);
  Am_Object::Get_Object((Am_Object *)&local_88,(Am_Slot_Key)&local_68,0x1ac);
  Am_Object::Get_Object((Am_Object *)&local_a0,(Am_Slot_Key)&local_88,0xc5);
  Am_Object::Set((Am_Object *)&local_a0,0xc9,scroll_group_v_inter_abort_do.from_wrapper,0);
  Am_Object::~Am_Object((Am_Object *)&local_a0);
  Am_Object::~Am_Object((Am_Object *)&local_88);
  Am_Object::Get_Object((Am_Object *)&local_a0,(Am_Slot_Key)&local_70,0xc5);
  pAVar1 = Am_Object::Set((Am_Object *)&local_a0,0x150,"Scroll Horizontal",0);
  pAVar1 = Am_Object::Set(pAVar1,0xca,scroll_group_h_do.from_wrapper,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&get_impl_parent_from_group);
  pAVar1 = Am_Object::Set(pAVar1,0x154,pAVar3,0);
  pAVar1 = Am_Object::Set(pAVar1,0x146,scroll_group_h_undo.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x147,scroll_group_h_undo.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x148,scroll_group_h_selective_undo.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x149,scroll_group_h_selective_repeat.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x14a,0,0);
  Am_Object::Set(pAVar1,0x167,-2,0);
  Am_Object::~Am_Object((Am_Object *)&local_a0);
  Am_Object::Get_Object((Am_Object *)&local_88,(Am_Slot_Key)&local_70,0x1ac);
  Am_Object::Get_Object((Am_Object *)&local_a0,(Am_Slot_Key)&local_88,0xc5);
  Am_Object::Set((Am_Object *)&local_a0,0xc9,scroll_group_h_inter_abort_do.from_wrapper,0);
  Am_Object::~Am_Object((Am_Object *)&local_a0);
  Am_Object::~Am_Object((Am_Object *)&local_88);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_90);
  return extraout_EAX;
}

Assistant:

static void
init()
{
  Am_Input_Char return_char = Am_Input_Char("RETURN");

  am_empty_dialog =
      Am_Window.Create(DSTR("empty_dialog_window"))
          .Set(Am_LEFT_OFFSET, 5) // used in width_of_layout
          .Set(Am_TOP_OFFSET, 5)  // used in height_of_layout
          .Set(Am_WIDTH, width_of_layout)
          .Set(Am_HEIGHT, height_of_layout)
          .Add(Am_WIDGET_LOOK, Am_Default_Widget_Look)
          .Set(Am_FILL_STYLE, Am_Motif_Gray)
          .Add(Am_ITEMS, 0)
          .Set(Am_V_SPACING, 5)
          .Set(Am_H_SPACING, 10)
          .Set(Am_H_ALIGN, Am_CENTER_ALIGN)
          .Add(Am_WIDGET_START_METHOD, Am_Show_Dialog_Method)
          .Add(Am_WIDGET_ABORT_METHOD, Am_Finish_Dialog_Method)
          .Add(Am_WIDGET_STOP_METHOD, Am_Finish_Dialog_Method)
          .Add(Am_VALUE, "")
          .Set(Am_VALUE, value_from_command.Multi_Constraint())
          .Set(Am_DESTROY_WINDOW_METHOD,
               Am_Default_Pop_Up_Window_Destroy_Method)
          .Add_Part(
              Am_COMMAND,
              Am_Command.Create(DSTR("Command_In_Dialog")).Set(Am_VALUE, ""))
          .Add_Part(
              Am_DIALOG_GROUP,
              Am_Widget_Group.Create(DSTR("Group_In_Dialog"))
                  .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                  .Set(Am_TOP, Am_Center_Y_Is_Center_Of_Owner)
                  .Set(Am_WIDTH, Am_Width_Of_Parts)
                  .Set(Am_HEIGHT, Am_Height_Of_Parts)
                  .Set(Am_LAYOUT, Am_Vertical_Layout)
                  .Set(Am_V_SPACING, Am_From_Owner(Am_V_SPACING))
                  .Set(Am_H_SPACING, Am_From_Owner(Am_H_SPACING))
                  .Set(Am_H_ALIGN, Am_From_Owner(Am_H_ALIGN))
                  .Add(Am_FILL_STYLE, Am_From_Owner(Am_FILL_STYLE))
                  .Add_Part(
                      Am_Map.Create(DSTR("Dialog_Prompt_Text"))
                          .Set_Part(Am_ITEM_PROTOTYPE,
                                    Am_Text.Create(DSTR("Prompt_Text_Proto"))
                                        .Add(Am_ITEM, "") //initialize
                                        .Set(Am_TEXT, Am_Same_As(Am_ITEM))
                                        .Set(Am_X_OFFSET, 0))
                          .Set(Am_LAYOUT, Am_Vertical_Layout)
                          .Set(Am_V_SPACING, Am_From_Owner(Am_V_SPACING))
                          .Set(Am_H_ALIGN, Am_From_Owner(Am_H_ALIGN))
                          .Set(Am_ITEMS, dialog_items)))
          .Get_Object(Am_COMMAND)
          .Set(Am_VALUE, "")
          //      .Set_Single_Constraint_Mode (Am_VALUE, false)
          .Get_Owner();

  Am_Alert_Dialog =
      am_empty_dialog.Create(DSTR("alert_dialog"))
          .Set(Am_TITLE, "Alert")
          .Set(Am_ICON_TITLE, "Alert")
          .Get_Object(Am_DIALOG_GROUP)
          .Add_Part(Am_Button.Create(DSTR("alert_dialog_ok"))
                        .Set(Am_WIDTH, 50)
                        .Set(Am_FILL_STYLE, Am_From_Owner(Am_FILL_STYLE))
                        .Set(Am_WIDGET_LOOK, Am_From_Owner(Am_WIDGET_LOOK))
                        .Get_Object(Am_COMMAND)
                        .Set(Am_LABEL, "OK")
                        .Set(Am_DEFAULT, true)
                        .Set(Am_ACCELERATOR, return_char)
                        .Set(Am_IMPLEMENTATION_PARENT, cmd_from_dialog)
                        //		 .Set (Am_DO_METHOD, do_hide_dialog)
                        .Get_Owner())
          .Get_Owner();
  ;

  Am_Text_Input_Dialog =
      am_empty_dialog.Create(DSTR("text_input_dialog"))
          .Set(Am_TITLE, "Text Input Dialog")
          .Set(Am_ICON_TITLE, "Text Input Dialog")
          .Add(Am_VALID_INPUT, true)
          // A high priority one-shot interactor to catch return presses.
          // It needs high priority to take precedence over the running text
          // widget.
          .Add_Part(Am_One_Shot_Interactor.Create(DSTR("text_catch_return"))
                        .Set(Am_START_WHEN, "RETURN")
                        .Set(Am_PRIORITY, 105)
                        .Set(Am_ACTIVE, valid_input)
                        .Get_Object(Am_COMMAND)
                        .Set(Am_IMPLEMENTATION_PARENT, cmd_from_dialog)
                        .Set(Am_DO_METHOD, input_dialog_stop)
                        .Get_Owner())
          .Get_Object(Am_COMMAND)
          .Set(Am_VALUE, "")
          .Set(Am_VALUE, value_from_text_part)
          .Get_Owner()
          .Get_Object(Am_DIALOG_GROUP)
          .Add_Part(Am_TEXT_WIDGET,
                    Am_Text_Input_Widget.Create(DSTR("text_input_in_dialog"))
                        .Set(Am_LEFT, Am_Center_X_Is_Center_Of_Owner)
                        .Set(Am_WIDTH, 200)
                        .Set(Am_LEFT_OFFSET, 0)
                        .Set(Am_FILL_STYLE, Am_From_Owner(Am_FILL_STYLE))
                        .Set(Am_WIDGET_LOOK, Am_From_Owner(Am_WIDGET_LOOK))
                        .Get_Object(Am_TEXT_WIDGET_TEXT_OBJ)
                        .Set(Am_TEXT, value_from_dialog)
                        .Get_Owner()
                        // we don't want the text widget to do anything on
                        // stop, because when you click outside a text widget
                        // it stops.  It interferes with the buttons.
                        .Get_Object(Am_COMMAND)
                        .Set(Am_LABEL, "")
                        .Get_Owner())
          .Add_Part(
              Am_DIALOG_BUTTONS,
              Am_Button_Panel.Create(DSTR("buttons_in_text_dialog"))
                  .Set(Am_FIXED_WIDTH, true)
                  .Set(Am_LAYOUT, Am_Horizontal_Layout)
                  .Set(Am_H_SPACING, Am_From_Owner(Am_H_SPACING))
                  .Set(Am_FILL_STYLE, Am_From_Owner(Am_FILL_STYLE))
                  .Set(Am_WIDGET_LOOK, Am_From_Owner(Am_WIDGET_LOOK))
                  .Set(
                      Am_ITEMS,
                      Am_Value_List()
                          .Add(Am_Command.Create(DSTR("text_input_okay"))
                                   .Set(Am_ACTIVE, valid_input)
                                   .Set(Am_LABEL, "OK")
                                   .Set(Am_DEFAULT, true)
                                   .Set(Am_IMPLEMENTATION_PARENT,
                                        cmd_from_dialog)
                                   .Set(Am_DO_METHOD, input_dialog_stop))
                          .Add(
                              Am_Command.Create(DSTR("text_input_cancel"))
                                  .Set(Am_LABEL, "Cancel")
                                  // don't want an implementation parent;
                                  // call the abort method of the dialog's command
                                  // explicitly.
                                  //.Set (Am_IMPLEMENTATION_PARENT, cmd_from_dialog)
                                  .Set(Am_DO_METHOD, input_dialog_abort))))
          .Get_Owner();
  ;

  Am_Choice_Dialog =
      am_empty_dialog.Create(DSTR("Choice_Dialog"))
          .Set(Am_TITLE, "Choice Dialog")
          .Set(Am_ICON_TITLE, "Choice Dialog")
          //    .Set (Am_VALUE, value_from_button_part)
          .Get_Object(Am_DIALOG_GROUP)
          .Add_Part(
              Am_DIALOG_BUTTONS,
              Am_Button_Panel.Create(DSTR("buttons_in_choice_dialog"))
                  .Set(Am_FIXED_WIDTH, true)
                  .Set(Am_LAYOUT, Am_Horizontal_Layout)
                  .Set(Am_H_SPACING, Am_From_Owner(Am_H_SPACING))
                  .Set(Am_FILL_STYLE, Am_From_Owner(Am_FILL_STYLE))
                  .Set(Am_WIDGET_LOOK, Am_From_Owner(Am_WIDGET_LOOK))
                  .Set(Am_ITEMS,
                       Am_Value_List()
                           .Add(Am_Command.Create(DSTR("choice_okay"))
                                    .Set(Am_LABEL, "OK")
                                    .Set(Am_DEFAULT, true)
                                    .Set(Am_ACCELERATOR, return_char)
                                    .Set(Am_IMPLEMENTATION_PARENT,
                                         cmd_from_dialog)
                                    .Set(Am_DO_METHOD, choice_dialog_stop))
                           .Add(Am_Command.Create(DSTR("choice_cancel"))
                                    .Set(Am_LABEL, "Cancel")
                                    .Set(Am_IMPLEMENTATION_PARENT,
                                         cmd_from_dialog)
                                    .Set(Am_DO_METHOD, choice_dialog_stop))))
          .Get_Owner();

  Am_Standard_OK_Command = Am_Command.Create(DSTR("Am_Standard_OK_Command"))
                               .Set(Am_VALUE, true)
                               .Set(Am_DO_METHOD, standard_ok_method)
                               .Set(Am_LABEL, "OK")
                               .Set(Am_DEFAULT, true)
                               .Set(Am_ACCELERATOR, return_char);
  Am_Standard_Cancel_Command =
      Am_Command.Create(DSTR("Am_Standard_Cancel_Command"))
          .Set(Am_VALUE, Am_No_Value)
          .Set(Am_DO_METHOD, standard_cancel_method)
          .Set(Am_LABEL, "Cancel");

  Am_About_Amulet_Command =
      Am_Command.Create(DSTR("Am_About_Amulet_Command"))
          .Set(Am_VALUE, Am_No_Value)
          .Set(Am_DO_METHOD, standard_about_amulet_method)
          .Set(Am_LABEL, "About Amulet")
          .Set(Am_IMPLEMENTATION_PARENT, true) //not undoable
      ;
}